

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O2

bool __thiscall GCSFilter::MatchAny(GCSFilter *this,ElementSet *elements)

{
  bool bVar1;
  long in_FS_OFFSET;
  vector<unsigned_long,_std::allocator<unsigned_long>_> queries;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  BuildHashedSet((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30,this,elements);
  bVar1 = MatchInternal(this,local_30._M_impl.super__Vector_impl_data._M_start,
                        (long)local_30._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_30._M_impl.super__Vector_impl_data._M_start >> 3);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool GCSFilter::MatchAny(const ElementSet& elements) const
{
    const std::vector<uint64_t> queries = BuildHashedSet(elements);
    return MatchInternal(queries.data(), queries.size());
}